

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void flatbuffers::Print<int>
               (int val,Type type,int indent,int indent_step,StructDef *param_5,string *_text)

{
  string local_30;
  
  NumToString<int>(&local_30,val);
  std::__cxx11::string::_M_append((char *)_text,(ulong)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Print(T val, Type type, int indent, int indent_step,
                                StructDef * /*union_sd*/, std::string *_text) {
  std::string &text = *_text;
  text += NumToString(val);
}